

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

int Lodtalk::executeScriptFromFileNamed(InterpreterProxy *interpreter,string *filename)

{
  int iVar1;
  FILE *__stream;
  string *name;
  string basePathString;
  string local_40;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"r");
  if (__stream == (FILE *)0x0) {
    nativeErrorFormat("Failed to open file \'%s\'",(filename->_M_dataplus)._M_p);
  }
  dirname((Lodtalk *)&local_40,(char *)filename);
  iVar1 = executeScriptFromFile(interpreter,(FILE *)__stream,name,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

int executeScriptFromFileNamed(InterpreterProxy *interpreter, const std::string &filename)
{
	StdFile file(filename, "r");
	if(!file)
		nativeErrorFormat("Failed to open file '%s'", filename.c_str());

	std::string basePathString = dirname(filename);

	return executeScriptFromFile(interpreter, file, filename, basePathString);
}